

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::extAddPairwiseToSI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *in_RDX;
  Literal *this_local;
  
  extAddPairwise<4,short,int>(__return_storage_ptr__,(wasm *)this,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extAddPairwiseToSI32x4() const {
  return extAddPairwise<4, int16_t, int32_t>(*this);
}